

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prometheus.cc
# Opt level: O1

void __thiscall
instrumentation::anon_unknown_0::prom_collector::write_<double>
          (prom_collector *this,metric_name *name,tags *t,double *v,char *metric_type)

{
  long *plVar1;
  double dVar2;
  _Alloc_hider _Var3;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  string pm_name;
  string local_48;
  
  (anonymous_namespace)::prom_collector::prom_metric_name_abi_cxx11_
            (&local_48,(prom_collector *)name,(metric_name *)t);
  if ((this->pending_help).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    if ((this->pending_help).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length != 0) {
      poVar4 = this->out;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"# HELP ",7);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_48._M_dataplus._M_p,local_48._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(this->pending_help).
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_payload._M_value._M_dataplus._M_p,
                          (this->pending_help).
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    }
    if ((this->pending_help).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      (this->pending_help).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      _Var3._M_p = (this->pending_help).
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p;
      plVar1 = (long *)((long)&(this->pending_help).
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload + 0x10);
      if ((long *)_Var3._M_p != plVar1) {
        operator_delete(_Var3._M_p,*plVar1 + 1);
      }
    }
    poVar4 = this->out;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"# TYPE ",7);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if (metric_type == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(metric_type);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,metric_type,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->out,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
  write_tags_(this,t);
  dVar2 = *v;
  if (NAN(dVar2)) {
    poVar4 = this->out;
    lVar6 = 5;
    pcVar7 = "\"NaN\"";
  }
  else {
    poVar4 = this->out;
    if (ABS(dVar2) != INFINITY) {
      std::ostream::_M_insert<double>(dVar2);
      goto LAB_0011b08c;
    }
    pcVar7 = "+Inf";
    if (dVar2 < 0.0) {
      pcVar7 = "-Inf";
    }
    lVar6 = 4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,lVar6);
LAB_0011b08c:
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void write_(const metric_name& name, const tags& t, const T& v, const char* metric_type = "untyped") {
    const auto pm_name = prom_metric_name(name);

    if (pending_help) {
      if (!pending_help->empty())
        out << "# HELP " << pm_name << " " << *pending_help << "\n";
      pending_help.reset();
      out << "# TYPE " << pm_name << " " << metric_type << "\n";
    }

    out << pm_name << "\t";
    write_tags_(t);

    if constexpr(std::is_floating_point_v<T>) {
      // For floating point, ensure we handle the edge cases correctly.
      if (std::isnan(v)) {
        out << R"("NaN")";
      } else if (std::isinf(v)) {
        out << (v < 0 ? R"(-Inf)" : R"(+Inf)");
      } else {
        out << v;
      }
    } else {
      out << v;
    }

    out << "\n";
  }